

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseBlanketJSCoverage.cxx
# Opt level: O1

bool __thiscall cmParseBlanketJSCoverage::JSONParser::ParseFile(JSONParser *this,string *file)

{
  char cVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  mapped_type *pmVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  uint uVar9;
  bool bVar10;
  FileLinesType localCoverageVector;
  string result;
  string line;
  string filename;
  string covResult;
  ifstream in;
  vector<int,_std::allocator<int>_> local_348;
  JSONParser *local_330;
  uint local_324;
  string local_320;
  string local_300;
  key_type local_2e0;
  string local_2c0;
  string local_2a0;
  ulong local_280;
  undefined1 *local_278;
  undefined8 local_270;
  undefined1 local_268;
  undefined7 uStack_267;
  int local_258;
  undefined4 uStack_254;
  long local_248 [2];
  long local_238 [4];
  uint auStack_218 [122];
  
  local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  local_2e0._M_string_length = 0;
  local_2e0.field_2._M_local_buf[0] = '\0';
  local_278 = &local_268;
  local_270 = 0;
  local_268 = 0;
  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
  local_300._M_string_length = 0;
  local_300.field_2._M_local_buf[0] = '\0';
  local_330 = this;
  std::ifstream::ifstream(local_238,(file->_M_dataplus)._M_p,_S_in);
  uVar9 = *(uint *)((long)auStack_218 + *(long *)(local_238[0] + -0x18));
  if ((uVar9 & 5) != 0) {
LAB_0028c8fd:
    std::ifstream::~ifstream(local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,
                      CONCAT71(local_300.field_2._M_allocated_capacity._1_7_,
                               local_300.field_2._M_local_buf[0]) + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,CONCAT71(uStack_267,local_268) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,
                      CONCAT71(local_2e0.field_2._M_allocated_capacity._1_7_,
                               local_2e0.field_2._M_local_buf[0]) + 1);
    }
    if (local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return (uVar9 & 5) == 0;
  }
  local_280 = 0;
  local_324 = uVar9;
  do {
    bVar10 = false;
    cVar1 = (char)local_280;
    while( true ) {
      bVar4 = cmsys::SystemTools::GetLineFromStream((istream *)local_238,&local_300,(bool *)0x0,-1);
      if (!bVar4) {
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ::operator[](&local_330->Coverage->TotalCoverage,&local_2e0);
        std::vector<int,_std::allocator<int>_>::operator=(pmVar7,&local_348);
        uVar9 = local_324;
        if (local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish !=
            local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start) {
          local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
        }
        goto LAB_0028c8fd;
      }
      lVar6 = std::__cxx11::string::find((char *)&local_300,0x5c9270,0);
      if (lVar6 != -1) break;
      lVar6 = std::__cxx11::string::find((char *)&local_300,0x58911b,0);
      if (((lVar6 == -1) || (cVar1 != '\x01')) || (!bVar10)) {
        lVar6 = std::__cxx11::string::find((char *)&local_300,0x58cd2f,0);
        if (lVar6 != -1) {
          bVar10 = true;
        }
      }
      else {
        local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2c0,local_300._M_dataplus._M_p,
                   local_300._M_dataplus._M_p + local_300._M_string_length);
        getValue(&local_320,local_330,&local_2c0,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::substr((ulong)&local_258,(ulong)&local_320);
        std::__cxx11::string::operator=((string *)&local_320,(string *)&local_258);
        if ((long *)CONCAT44(uStack_254,local_258) != local_248) {
          operator_delete((long *)CONCAT44(uStack_254,local_258),local_248[0] + 1);
        }
        iVar5 = std::__cxx11::string::compare((char *)&local_320);
        if (iVar5 == 0) {
          local_258 = -1;
          if (local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            *local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish = -1;
            goto LAB_0028c757;
          }
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_348,
                     (iterator)
                     local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_258);
        }
        else {
          local_258 = atoi(local_320._M_dataplus._M_p);
          if (local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_348,
                       (iterator)
                       local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_258);
          }
          else {
            *local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish = local_258;
LAB_0028c757:
            local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != &local_320.field_2) {
          operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if ((local_280 & 1) != 0) {
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::operator[](&local_330->Coverage->TotalCoverage,&local_2e0);
      std::vector<int,_std::allocator<int>_>::operator=(pmVar7,&local_348);
      if (local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
    }
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a0,local_300._M_dataplus._M_p,
               local_300._M_dataplus._M_p + local_300._M_string_length);
    getValue(&local_320,local_330,&local_2a0,0);
    sVar3 = local_2e0._M_string_length;
    _Var2._M_p = local_320._M_dataplus._M_p;
    strlen(local_320._M_dataplus._M_p);
    std::__cxx11::string::_M_replace((ulong)&local_2e0,0,(char *)sVar3,(ulong)_Var2._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    paVar8 = &local_2a0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar8) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
      paVar8 = extraout_RAX;
    }
    local_280 = CONCAT71((int7)((ulong)paVar8 >> 8),1);
  } while( true );
}

Assistant:

bool ParseFile(std::string file)
    {
    FileLinesType localCoverageVector;
    std::string filename;
    bool foundFile = false;
    bool inSource  = false;
    std::string covResult;
    std::string line;

    cmsys::ifstream in(file.c_str());
    if(!in)
      {
      return false;
      }
    while(  cmSystemTools::GetLineFromStream(in, line))
      {
      if(line.find("filename") != line.npos)
        {
        if(foundFile)
          {
          /*
          * Upon finding a second file name, generate a
          * vector within the total coverage to capture the
          * information in the local vector
          */
          FileLinesType& CoverageVector =
              this->Coverage.TotalCoverage[filename];
          CoverageVector = localCoverageVector;
          localCoverageVector.clear();
          }
        foundFile= true;
        inSource = false;
        filename = getValue(line,0).c_str();
        }
      else if((line.find("coverage") != line.npos) && foundFile && inSource )
        {
        /*
        *  two types of "coverage" in the JSON structure
        *
        *  The coverage result over the file or set of files
        *  and the coverage for each individual line
        *
        *  FoundFile and foundSource ensure that
        *  only the value of the line coverage is captured
        */
        std::string result = getValue(line,1);
        result = result.substr(2,result.npos);
        if(result == "\"\"")
          {
          // Empty quotation marks indicate that the
          // line is not executable
          localCoverageVector.push_back(-1);
          }
        else
          {
          // Else, it contains the number of time executed
          localCoverageVector.push_back(atoi(result.c_str()));
          }
        }
      else if(line.find("source") != line.npos)
        {
        inSource=true;
        }
      }

    // On exit, capture end of last file covered.
    FileLinesType& CoverageVector =
        this->Coverage.TotalCoverage[filename];
    CoverageVector = localCoverageVector;
    localCoverageVector.clear();
    return true;
    }